

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_chameleon::llm_build_chameleon
          (llm_build_chameleon *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  const_reference pvVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ggml_backend_buffer *name;
  int extraout_var;
  ggml_tensor *pgVar8;
  ggml_tensor *pgVar9;
  ggml_tensor *pgVar10;
  pointer plVar11;
  undefined8 in_RCX;
  long in_RSI;
  long in_RDI;
  ggml_tensor *img_logits;
  int num_img_tokens;
  int img_token_start_idx;
  int img_token_end_idx;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *inpSA;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffcc8;
  int iVar12;
  llm_graph_context *in_stack_fffffffffffffcd0;
  ggml_tensor *in_stack_fffffffffffffcd8;
  ggml_tensor *in_stack_fffffffffffffce0;
  ggml_tensor *pgVar13;
  ggml_tensor *in_stack_fffffffffffffce8;
  undefined4 uVar14;
  ggml_tensor *cur_00;
  llm_graph_context *in_stack_fffffffffffffcf0;
  ggml_tensor *in_stack_fffffffffffffd20;
  ggml_tensor *in_stack_fffffffffffffd28;
  llm_graph_context *in_stack_fffffffffffffd30;
  ggml_tensor *in_stack_fffffffffffffd48;
  ggml_tensor *in_stack_fffffffffffffd50;
  ggml_tensor *in_stack_fffffffffffffd58;
  ggml_tensor *in_stack_fffffffffffffd60;
  ggml_tensor *in_stack_fffffffffffffd68;
  ggml_tensor *in_stack_fffffffffffffd70;
  ggml_tensor *in_stack_fffffffffffffd80;
  ggml_tensor *in_stack_fffffffffffffda8;
  ggml_tensor *in_stack_fffffffffffffdb0;
  ggml_tensor *in_stack_fffffffffffffdb8;
  int iVar15;
  ggml_tensor *in_stack_fffffffffffffdd8;
  llm_graph_context *in_stack_fffffffffffffde0;
  ggml_tensor *in_stack_fffffffffffffe90;
  ggml_tensor *in_stack_fffffffffffffe98;
  ggml_tensor *in_stack_fffffffffffffea0;
  ggml_tensor *in_stack_fffffffffffffea8;
  ggml_cgraph *in_stack_fffffffffffffeb0;
  ggml_tensor *in_stack_fffffffffffffeb8;
  ggml_tensor *in_stack_fffffffffffffec0;
  ggml_tensor *in_stack_fffffffffffffed0;
  ggml_tensor *in_stack_fffffffffffffed8;
  ggml_tensor *in_stack_fffffffffffffee0;
  ggml_tensor *in_stack_fffffffffffffee8;
  ggml_tensor *in_stack_fffffffffffffef0;
  ggml_tensor *local_78;
  ggml_tensor *local_70;
  ggml_tensor *local_68;
  int local_5c;
  ggml_tensor *local_48;
  ggml_tensor *local_40;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffce0,
             (llm_graph_params *)in_stack_fffffffffffffcd8);
  pgVar10 = (ggml_tensor *)(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x24);
  if (pgVar10 != (ggml_tensor *)(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x2f5e,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  if (pgVar10 == (ggml_tensor *)(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x14)) {
    local_48 = llm_graph_context::build_inp_embd
                         (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    pgVar1 = llm_graph_context::build_inp_pos(in_stack_fffffffffffffd30);
    llm_graph_context::build_attn_inp_kv_unified((llm_graph_context *)in_stack_fffffffffffffd70);
    for (local_5c = 0; iVar12 = (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
        (long)local_5c < *(long *)(in_RDI + 0x28); local_5c = local_5c + 1) {
      local_68 = local_48;
      if ((*(byte *)(*(long *)(in_RDI + 8) + 3) & 1) == 0) {
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_5c);
        llm_graph_context::build_norm
                  (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                   in_stack_fffffffffffffcd8,
                   (llm_norm_type)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                   (int)in_stack_fffffffffffffcd0);
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                   (char *)in_stack_fffffffffffffcd0,iVar12);
      }
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_5c);
      local_70 = llm_graph_context::build_lora_mm
                           (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                            in_stack_fffffffffffffd20);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                 (char *)in_stack_fffffffffffffcd0,iVar12);
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_5c);
      local_78 = llm_graph_context::build_lora_mm
                           (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                            in_stack_fffffffffffffd20);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                 (char *)in_stack_fffffffffffffcd0,iVar12);
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_5c);
      pgVar2 = llm_graph_context::build_lora_mm
                         (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                          in_stack_fffffffffffffd20);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                 (char *)in_stack_fffffffffffffcd0,iVar12);
      pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_5c);
      if (pvVar3->attn_q_norm != (ggml_tensor *)0x0) {
        in_stack_fffffffffffffee0 = *(ggml_tensor **)(in_RDI + 0x48);
        in_stack_fffffffffffffee8 = *(ggml_tensor **)(in_RDI + 0xc0);
        iVar15 = *(int *)(in_RDI + 0xa8);
        in_stack_fffffffffffffef0 = local_70;
        lVar4 = ggml_element_size();
        in_stack_fffffffffffffed0 = (ggml_tensor *)(lVar4 * (long)pgVar10);
        in_stack_fffffffffffffed8 = (ggml_tensor *)ggml_element_size(local_70);
        iVar12 = (int)((ulong)((long)in_stack_fffffffffffffed8 * (long)pgVar10 *
                              *(long *)(in_RDI + 0x48)) >> 0x20);
        in_stack_fffffffffffffcd0 = (llm_graph_context *)0x0;
        in_stack_fffffffffffffeb0 =
             (ggml_cgraph *)
             ggml_view_3d(in_stack_fffffffffffffee8,in_stack_fffffffffffffef0,pgVar10,
                          in_stack_fffffffffffffee0,(long)iVar15,in_stack_fffffffffffffed0);
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                   (char *)in_stack_fffffffffffffcd0,iVar12);
        pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_5c);
        in_stack_fffffffffffffeb8 = pvVar3->attn_q_norm;
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_5c);
        local_70 = llm_graph_context::build_norm
                             (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                              in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                              (llm_norm_type)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                              (int)in_stack_fffffffffffffcd0);
        in_stack_fffffffffffffec0 = local_70;
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                   (char *)in_stack_fffffffffffffcd0,iVar12);
      }
      pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_5c);
      if (pvVar3->attn_k_norm != (ggml_tensor *)0x0) {
        uVar6 = *(undefined8 *)(in_RDI + 0x50);
        uVar7 = *(undefined8 *)(in_RDI + 0xc0);
        in_stack_fffffffffffffea0 = (ggml_tensor *)(long)*(int *)(in_RDI + 0xa8);
        in_stack_fffffffffffffe90 = local_78;
        in_stack_fffffffffffffe98 = pgVar10;
        in_stack_fffffffffffffea8 = (ggml_tensor *)ggml_element_size();
        lVar4 = (long)in_stack_fffffffffffffea8 * (long)pgVar10;
        lVar5 = ggml_element_size(local_78);
        iVar12 = (int)((ulong)(lVar5 * (long)pgVar10 * *(long *)(in_RDI + 0x50)) >> 0x20);
        in_stack_fffffffffffffcd0 = (llm_graph_context *)0x0;
        ggml_view_3d(uVar7,in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,uVar6,
                     in_stack_fffffffffffffea0,lVar4);
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                   (char *)in_stack_fffffffffffffcd0,iVar12);
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_5c);
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_5c);
        local_78 = llm_graph_context::build_norm
                             (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                              in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                              (llm_norm_type)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                              (int)in_stack_fffffffffffffcd0);
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                   (char *)in_stack_fffffffffffffcd0,iVar12);
      }
      uVar14 = (undefined4)((ulong)in_stack_fffffffffffffce8 >> 0x20);
      uVar6 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),local_70,pgVar10,
                              *(undefined8 *)(in_RDI + 0x48),(long)*(int *)(in_RDI + 0xa8));
      uVar7 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),local_78,pgVar10,
                              *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
      name = (ggml_backend_buffer *)
             ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar2,pgVar10,
                             *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
      ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                    *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                    *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                    *(undefined8 *)(in_RDI + 0xc0),uVar6,pgVar1,0,*(undefined4 *)(in_RDI + 0x30),
                    *(undefined4 *)(in_RDI + 0xb8));
      ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                    *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                    *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                    *(undefined8 *)(in_RDI + 0xc0),uVar7,pgVar1,0,*(undefined4 *)(in_RDI + 0x30),
                    *(undefined4 *)(in_RDI + 0xb8));
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                 (char *)in_stack_fffffffffffffcd0,iVar12);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                 (char *)in_stack_fffffffffffffcd0,iVar12);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                 (char *)in_stack_fffffffffffffcd0,iVar12);
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_5c);
      sqrtf((float)(long)pgVar10);
      cur_00 = (ggml_tensor *)CONCAT44(uVar14,local_5c);
      pgVar13 = (ggml_tensor *)0x0;
      pgVar2 = (ggml_tensor *)0x0;
      iVar12 = extraout_var;
      local_40 = llm_graph_context::build_attn
                           ((llm_graph_context *)in_stack_fffffffffffffec0,
                            (llm_graph_input_attn_kv_unified *)in_stack_fffffffffffffeb8,
                            in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                            in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                            in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,
                            in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,
                            (float)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                            (int)in_stack_fffffffffffffef0);
      if ((*(byte *)(*(long *)(in_RDI + 8) + 3) & 1) != 0) {
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_5c);
        local_40 = llm_graph_context::build_norm
                             (in_stack_fffffffffffffcf0,cur_00,pgVar13,pgVar2,
                              (llm_norm_type)((ulong)name >> 0x20),(int)name);
      }
      if ((long)local_5c == *(long *)(in_RDI + 0x28) + -1) {
        pgVar8 = llm_graph_context::build_inp_out_ids
                           ((llm_graph_context *)in_stack_fffffffffffffd20);
        local_40 = (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_40,pgVar8);
        local_68 = (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_48,pgVar8);
      }
      pgVar9 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),local_40,local_68);
      pgVar8 = pgVar9;
      llm_graph_context::cb((llm_graph_context *)pgVar13,pgVar2,(char *)name,iVar12);
      iVar15 = (int)pgVar8;
      if ((*(byte *)(*(long *)(in_RDI + 8) + 3) & 1) == 0) {
        in_stack_fffffffffffffdb0 = pgVar9;
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_5c);
        local_40 = llm_graph_context::build_norm
                             (in_stack_fffffffffffffcf0,cur_00,pgVar13,pgVar2,
                              (llm_norm_type)((ulong)name >> 0x20),(int)name);
        in_stack_fffffffffffffdb8 = local_40;
        llm_graph_context::cb((llm_graph_context *)pgVar13,pgVar2,(char *)name,iVar12);
      }
      pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_5c);
      pgVar2 = pvVar3->ffn_up;
      pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_5c);
      pgVar13 = pvVar3->ffn_gate;
      pvVar3 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_5c);
      in_stack_fffffffffffffcd8 = pvVar3->ffn_down;
      in_stack_fffffffffffffcf0 = (llm_graph_context *)0x0;
      in_stack_fffffffffffffce8 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffce0 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffcd0 = (llm_graph_context *)0x0;
      in_stack_fffffffffffffcc8 = (ggml_tensor *)0x0;
      local_40 = llm_graph_context::build_ffn
                           ((llm_graph_context *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68
                            ,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                            in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                            in_stack_fffffffffffffd80,local_40,pgVar2,pgVar13,
                            (ggml_tensor *)&stack0xfffffffffffffcc8,in_stack_fffffffffffffda8,
                            (llm_ffn_op_type)in_stack_fffffffffffffdb0,
                            (llm_ffn_gate_type)in_stack_fffffffffffffdb8,iVar15);
      in_stack_fffffffffffffda8 = local_40;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                 (char *)in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
      if ((*(byte *)(*(long *)(in_RDI + 8) + 3) & 1) != 0) {
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_5c);
        local_40 = llm_graph_context::build_norm
                             (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                              in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                              (llm_norm_type)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                              (int)in_stack_fffffffffffffcd0);
        in_stack_fffffffffffffd80 = local_40;
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                   (char *)in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20)
                  );
      }
      in_stack_fffffffffffffd70 =
           (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),local_40,pgVar9);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                 (char *)in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
      local_48 = llm_graph_context::build_cvec
                           (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,0);
      in_stack_fffffffffffffd68 = local_48;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                 (char *)in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
    }
    pgVar10 = llm_graph_context::build_norm
                        (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                         in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                         (llm_norm_type)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                         (int)in_stack_fffffffffffffcd0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
               (char *)in_stack_fffffffffffffcd0,iVar12);
    plVar11 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                        ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                         0x4ff4a5);
    plVar11->t_embd = pgVar10;
    pgVar10 = llm_graph_context::build_lora_mm
                        (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                         in_stack_fffffffffffffd20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
               (char *)in_stack_fffffffffffffcd0,iVar12);
    uVar6 = ggml_new_tensor_1d(*(undefined8 *)(in_RDI + 0xc0),0,0x2000);
    uVar7 = ggml_clamp(0xff7fffff,*(undefined8 *)(in_RDI + 0xc0),uVar6);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
               (char *)in_stack_fffffffffffffcd0,iVar12);
    uVar6 = *(undefined8 *)(in_RDI + 0xc0);
    lVar4 = ggml_element_size();
    pgVar10 = (ggml_tensor *)ggml_set_1d(uVar6,pgVar10,uVar7,lVar4 * 4);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
               (char *)in_stack_fffffffffffffcd0,iVar12);
    plVar11 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                        ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                         0x4ff68c);
    plVar11->t_logits = pgVar10;
    ggml_build_forward_expand(in_RCX,pgVar10);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,0x2f5f,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_rot");
}

Assistant:

llm_build_chameleon(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            if (hparams.swin_norm) {
                cur = inpL;
            } else {
                cur = build_norm(inpL,
                        model.layers[il].attn_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "attn_norm", il);
            }

            // self-attention
            {
                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);

                if (model.layers[il].attn_q_norm) {
                    Qcur = ggml_view_3d(ctx0, Qcur, n_embd_head, n_head, n_tokens,
                            ggml_element_size(Qcur) * n_embd_head,
                            ggml_element_size(Qcur) * n_embd_head * n_head,
                            0);
                    cb(Qcur, "Qcur", il);

                    Qcur = build_norm(Qcur,
                            model.layers[il].attn_q_norm,
                            model.layers[il].attn_q_norm_b,
                            LLM_NORM, il);
                    cb(Qcur, "Qcur", il);
                }

                if (model.layers[il].attn_k_norm) {
                    Kcur = ggml_view_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens,
                            ggml_element_size(Kcur) * n_embd_head,
                            ggml_element_size(Kcur) * n_embd_head * n_head_kv,
                            0);
                    cb(Kcur, "Kcur", il);

                    Kcur = build_norm(Kcur,
                            model.layers[il].attn_k_norm,
                            model.layers[il].attn_k_norm_b,
                            LLM_NORM, il);
                    cb(Kcur, "Kcur", il);
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, nullptr,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);

                if (hparams.swin_norm) {
                    cur = build_norm(cur,
                            model.layers[il].attn_norm, NULL,
                            LLM_NORM_RMS, il);
                }
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network
            if (!hparams.swin_norm) {
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);
            }

            cur = build_ffn(cur,
                    model.layers[il].ffn_up,   NULL, NULL,
                    model.layers[il].ffn_gate, NULL, NULL,
                    model.layers[il].ffn_down, NULL, NULL,
                    NULL,
                    LLM_FFN_SILU, LLM_FFN_PAR, il);
            cb(cur, "ffn_out", il);

            if (hparams.swin_norm) {
                cur = build_norm(cur,
                        model.layers[il].ffn_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);
            cb(cur, "ffn_out", il);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);
        cb(cur, "result_output_with_img_logits", -1);

        // TODO: this suppresses the output of image tokens, which is required to enable text-only outputs.
        // Needs to be removed once image outputs are supported.
        int img_token_end_idx = 8196;
        int img_token_start_idx = 4;
        int num_img_tokens = img_token_end_idx - img_token_start_idx;
        // creates 1d tensor of size num_img_tokens and values -FLT_MAX,
        // which ensures that text token values are always at least larger than image token values
        ggml_tensor * img_logits = ggml_new_tensor_1d(ctx0, GGML_TYPE_F32, num_img_tokens);
        img_logits = ggml_clamp(ctx0, img_logits, -FLT_MAX, -FLT_MAX);
        cb(img_logits, "img_logits", -1);

        cur = ggml_set_1d(ctx0, cur, img_logits, ggml_element_size(cur) * img_token_start_idx);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }